

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plycmd.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  Model *pMVar6;
  int __oflag;
  uint uVar7;
  bool merge_double_vertices;
  float scale;
  string p;
  double ext_height;
  double ext_scale;
  string bout;
  string name;
  string aout;
  string spath;
  Parameter param;
  char *def [29];
  PLYReader ply;
  
  memcpy(def,&PTR_anon_var_dwarf_2fad_001723e0,0xe8);
  gutil::Parameter::Parameter(&param,argc,argv,def,(char *)0x0);
  if ((int)((ulong)((long)param.list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)param.list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)param.pos < 1) {
    gutil::Parameter::printHelp(&param,(ostream *)&std::cout,0x50);
    iVar3 = 10;
    bVar1 = false;
  }
  else {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    spath._M_dataplus._M_p = (pointer)&spath.field_2;
    spath._M_string_length = 0;
    aout._M_dataplus._M_p = (pointer)&aout.field_2;
    aout._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    spath.field_2._M_local_buf[0] = '\0';
    aout.field_2._M_local_buf[0] = '\0';
    bout._M_dataplus._M_p = (pointer)&bout.field_2;
    bout._M_string_length = 0;
    scale = 1.0;
    ext_scale = 0.0;
    bout.field_2._M_local_buf[0] = '\0';
    ext_height = 0.0;
    pcVar4 = getenv("CVKIT_SPATH");
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&spath);
    }
    bVar1 = gutil::Parameter::isNextParameter(&param);
    if (!bVar1) {
      gutil::Parameter::nextString(&param,&name,(char *)0x0);
    }
    uVar7 = 1;
    merge_double_vertices = false;
    do {
      if ((int)((ulong)((long)param.list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)param.list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)param.pos < 1)
      {
        bVar1 = true;
        iVar3 = 0;
        if (bout._M_string_length == 0 && aout._M_string_length == 0) goto LAB_00121663;
        if (name._M_string_length == 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"No input file given!");
          std::endl<char,std::char_traits<char>>(poVar5);
          bVar1 = false;
          iVar3 = 10;
          goto LAB_00121663;
        }
        if ((ext_scale <= 0.0) || (ext_height <= 0.0)) {
          pMVar6 = gvr::loadModel(name._M_dataplus._M_p,spath._M_dataplus._M_p,true,
                                  merge_double_vertices);
        }
        else {
          pMVar6 = gvr::createModelFromContours(name._M_dataplus._M_p,ext_scale,ext_height);
        }
        if ((scale != 1.0) || (NAN(scale))) {
          (*pMVar6->_vptr_Model[2])(pMVar6);
        }
        if (aout._M_string_length != 0) {
          (*pMVar6->_vptr_Model[7])(pMVar6,aout._M_dataplus._M_p,(ulong)uVar7,0);
        }
        if (bout._M_string_length == 0) {
          iVar3 = 0;
          if (pMVar6 == (Model *)0x0) goto LAB_00121663;
        }
        else if ((bout._M_string_length < 5) ||
                ((iVar3 = std::__cxx11::string::compare
                                    ((ulong)&bout,bout._M_string_length - 4,(char *)0x4), iVar3 != 0
                 && (iVar3 = std::__cxx11::string::compare
                                       ((ulong)&bout,bout._M_string_length - 4,(char *)0x4),
                    iVar3 != 0)))) {
          (*pMVar6->_vptr_Model[7])(pMVar6,bout._M_dataplus._M_p,(ulong)uVar7,1);
        }
        else {
          (*pMVar6->_vptr_Model[8])(pMVar6,bout._M_dataplus._M_p);
        }
        (*pMVar6->_vptr_Model[1])(pMVar6);
        iVar3 = 0;
        goto LAB_00121663;
      }
      p._M_dataplus._M_p = (pointer)&p.field_2;
      p._M_string_length = 0;
      p.field_2._M_local_buf[0] = '\0';
      gutil::Parameter::nextParameter(&param,&p);
      bVar1 = std::operator==(&p,"-help");
      if (bVar1) {
        gutil::Parameter::printHelp(&param,(ostream *)&std::cout,0x50);
LAB_00121345:
        bVar1 = false;
      }
      else {
        bVar1 = std::operator==(&p,"-version");
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"This program is part of cvkit version ");
          poVar5 = std::operator<<(poVar5,"2.6.17");
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_00121345;
        }
        bVar1 = std::operator==(&p,"-spath");
        if (bVar1) {
          gutil::Parameter::nextString(&param,&spath,(char *)0x0);
        }
        bVar1 = std::operator==(&p,"-header");
        if (bVar1) {
          gvr::PLYReader::PLYReader(&ply);
          iVar3 = gvr::PLYReader::open(&ply,name._M_dataplus._M_p,__oflag);
          if ((char)iVar3 == '\0') {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Not a ply file: ");
            poVar5 = std::operator<<(poVar5,(string *)&name);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          else {
            gvr::PLYReader::printHeader(&ply);
          }
          gvr::PLYReader::~PLYReader(&ply);
        }
        bVar1 = std::operator==(&p,"-merge");
        bVar2 = std::operator==(&p,"-reduce");
        if (bVar2) {
          uVar7 = 0;
        }
        bVar2 = std::operator==(&p,"-mul");
        if (bVar2) {
          gutil::Parameter::nextValue<float>(&param,&scale);
        }
        bVar2 = std::operator==(&p,"-extrusion");
        if (bVar2) {
          gutil::Parameter::nextValue<double>(&param,&ext_scale);
          gutil::Parameter::nextValue<double>(&param,&ext_height);
        }
        bVar2 = std::operator==(&p,"-ascii");
        if (bVar2) {
          gutil::Parameter::nextString(&param,&aout,(char *)0x0);
        }
        merge_double_vertices = (bool)(bVar1 | merge_double_vertices);
        bVar2 = std::operator==(&p,"-out");
        bVar1 = true;
        if (bVar2) {
          gutil::Parameter::nextString(&param,&bout,(char *)0x0);
        }
      }
      std::__cxx11::string::~string((string *)&p);
    } while (bVar1);
    bVar1 = false;
    iVar3 = 0;
LAB_00121663:
    std::__cxx11::string::~string((string *)&bout);
    std::__cxx11::string::~string((string *)&aout);
    std::__cxx11::string::~string((string *)&spath);
    std::__cxx11::string::~string((string *)&name);
  }
  gutil::Parameter::~Parameter(&param);
  if (bVar1) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
  try
  {
    const char *def[]=
    {
      "# plycmd <file> [<options>]",
      "#",
      "# The input file may be given in ply or stl format or as depth file. In case of a depth file, optional parameters may be appended to the file name, separated by commas. Parameters are:",
      "#",
      "# p=<parameter file>",
      "# i=<image file>",
      "# ds=<s>",
      "# x=<x>,y=<y>,w=<w>,h=<h>",
      "# s=<max step>",
      "#",
      "# Options are:",
      "#",
      "-help # Print help and exit.",
      "-version # Print version and exit.",
      "-spath # Search path for finding parameter files or images that are associated with the depth image. Default is the content of the environment variable CVKIT_SPATH.",
      " <dir list> # List of directories.",
      "-header # Print header of ply file.",
      "-merge # Merge double vertices. This only applies to STL files. Loading can take much longer.",
      "-reduce # Removes all data that is unnecessary for visualization.",
      "-mul # Multiply the given factor to all vertices.",
      " <s> # Scaling factor.",
      "-extrusion # Creates a ply file from contours of a binary image. Pixel of the brightest color are foreground, all others are background.",
      " <scale> # Factor scaling the x/y pixel coordinates.",
      " <height> # Height of object.",
      "-ascii # Store in ascii ply format.",
      " <file> # Output file.",
      "-out # Store in binary ply or stl format (depending on suffix).",
      " <file> # Output file.",
      0
    };

    gutil::Parameter param(argc, argv, def);

    if (param.remaining() < 1)
    {
      param.printHelp(std::cout);
      return 10;
    }

    // handle options

    std::string name;
    std::string spath;
    bool   merge=false;
    bool   all=true;
    float scale=1.0f;
    std::string aout;
    std::string bout;
    double ext_scale=0;
    double ext_height=0;

    if (getenv("CVKIT_SPATH") != 0)
    {
      spath=getenv("CVKIT_SPATH");
    }

    if (!param.isNextParameter())
    {
      param.nextString(name);
    }

    while (param.remaining() > 0)
    {
      std::string p;

      param.nextParameter(p);

      if (p == "-help")
      {
        param.printHelp(std::cout);
        return 0;
      }

      if (p == "-version")
      {
        std::cout << "This program is part of cvkit version " << VERSION << std::endl;
        return 0;
      }

      if (p == "-spath")
      {
        param.nextString(spath);
      }

      if (p == "-header")
      {
        gvr::PLYReader ply;

        if (ply.open(name.c_str()))
        {
          ply.printHeader();
        }
        else
        {
          std::cerr << "Not a ply file: " << name << std::endl;
        }
      }

      if (p == "-merge")
      {
        merge=true;
      }

      if (p == "-reduce")
      {
        all=false;
      }

      if (p == "-mul")
      {
        param.nextValue(scale);
      }

      if (p == "-extrusion")
      {
        param.nextValue(ext_scale);
        param.nextValue(ext_height);
      }

      if (p == "-ascii")
      {
        param.nextString(aout);
      }

      if (p == "-out")
      {
        param.nextString(bout);
      }
    }

    if (aout.size() > 0 || bout.size() > 0)
    {
      if (name.size() > 0)
      {
        gvr::Model *model=0;

        if (ext_scale > 0 && ext_height > 0)
        {
          model=gvr::createModelFromContours(name.c_str(), ext_scale, ext_height);
        }
        else
        {
          model=gvr::loadModel(name.c_str(), spath.c_str(), true, merge);
        }

        if (scale != 1.0f)
        {
          model->scale(scale);
        }

        if (aout.size() > 0)
        {
          model->savePLY(aout.c_str(), all, gvr::ply_ascii);
        }

        if (bout.size() > 0)
        {
          if (bout.size() > 4 && (bout.compare(bout.size()-4, 4, ".stl") == 0 ||
            bout.compare(bout.size()-4, 4, ".STL") == 0))
          {
            model->saveSTL(bout.c_str());
          }
          else
          {
            model->savePLY(bout.c_str(), all, gvr::ply_binary);
          }
        }

        delete model;
      }
      else
      {
        std::cerr << "No input file given!" << std::endl;
        return 10;
      }
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
  }

  return 0;
}